

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::CBString::join(CBString *this,CBStringList *l,uchar sep)

{
  int *piVar1;
  CBStringException *pCVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int len;
  long lVar6;
  ulong uVar7;
  CBStringException bstr__cppwrapper_exception;
  CBStringException CStack_b8;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->super_tagbstring).mlen < 1) {
LAB_00158d85:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"CBString::Write protection error","");
    CBStringException::CBStringException(&CStack_b8,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&CStack_b8);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  lVar3 = *(long *)(l + 8) - *(long *)l;
  if (lVar3 == 0) {
    len = 1;
  }
  else {
    lVar3 = (lVar3 >> 3) * -0x5555555555555555;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    piVar1 = (int *)(*(long *)l + 0xc);
    len = 1;
    do {
      len = len + *piVar1 + 1;
      if (len < 1) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"CBString::Failure in (CBStringList) constructor, too long",
                   "");
        CBStringException::CBStringException(&CStack_b8,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
        CBStringException::CBStringException(pCVar2,&CStack_b8);
        __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
      }
      piVar1 = piVar1 + 6;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  alloc(this,len);
  (this->super_tagbstring).slen = 0;
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).mlen = 0;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"CBString::Failure in (CBStringList) constructor","");
    CBStringException::CBStringException(&CStack_b8,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&CStack_b8);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  lVar3 = *(long *)l;
  lVar4 = *(long *)(l + 8);
  if (lVar4 != lVar3) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      if (uVar7 != 0) {
        operator+=(this,sep);
        lVar3 = *(long *)l;
        lVar4 = *(long *)(l + 8);
      }
      uVar5 = (lVar4 - lVar3 >> 3) * -0x5555555555555555;
      if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
        goto LAB_00158d85;
      }
      operator+=(this,(CBString *)(lVar3 + lVar6));
      uVar7 = uVar7 + 1;
      lVar3 = *(long *)l;
      lVar4 = *(long *)(l + 8);
      lVar6 = lVar6 + 0x18;
    } while (uVar7 < (ulong)((lVar4 - lVar3 >> 3) * -0x5555555555555555));
  }
  return;
}

Assistant:

void CBString::join (const struct CBStringList& l, unsigned char sep) {
int c;
size_t i;

	if (mlen <= 0) {
		bstringThrow ("Write protection error");
	}

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen + 1;
		if (c <= 0) bstringThrow ("Failure in (CBStringList) constructor, too long");
	}

	alloc (c);
	slen = 0;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			if (i > 0) *this += sep;
			*this += l.at(i);
		}
	}
}